

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJs.cpp
# Opt level: O0

bool Js::AsmJSCompiler::CheckFunctionTables(AsmJsModuleCompiler *m)

{
  uint val;
  code *pcVar1;
  bool bVar2;
  AsmJSParser *val_00;
  undefined4 *puVar3;
  ParseNode *pPVar4;
  ParseNodeVar *pPVar5;
  ParseNodeArrLit *pPVar6;
  IdentPtr pIVar7;
  AsmJsSymbol *pAVar8;
  ParseNode *local_48;
  ParseNode *pnode;
  AsmJsFunctionTable *ftable;
  uint tableSize;
  ParseNode *varStmt;
  int32 funcPtrTableCount;
  AsmJSParser *list;
  AsmJsModuleCompiler *m_local;
  
  val_00 = AsmJsModuleCompiler::GetCurrentParserNode(m);
  if ((*val_00)->nop != knopList) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJs.cpp"
                                ,0x2df,"(list->nop == knopList)","list->nop == knopList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  varStmt._4_4_ = 0;
  while( true ) {
    if ((((*val_00)->nop == knopEndCode) ||
        (((pPVar4 = ParserWrapper::GetBinaryLeft(*val_00), pPVar4->nop != knopConstDecl &&
          (pPVar4->nop != knopVarDecl)) ||
         (pPVar5 = ParseNode::AsParseNodeVar(pPVar4), pPVar5->pnodeInit == (ParseNodePtr)0x0)))) ||
       (pPVar5 = ParseNode::AsParseNodeVar(pPVar4), pPVar5->pnodeInit->nop != knopArray)) {
      AsmJsModuleCompiler::SetFuncPtrTableCount(m,varStmt._4_4_);
      AsmJsModuleCompiler::SetCurrentParseNode(m,val_00);
      return true;
    }
    pPVar5 = ParseNode::AsParseNodeVar(pPVar4);
    pPVar6 = ParseNode::AsParseNodeArrLit(pPVar5->pnodeInit);
    val = pPVar6->count;
    bVar2 = ::Math::IsPow2(val);
    if (!bVar2) {
      pIVar7 = ParseNode::name(pPVar4);
      bVar2 = AsmJsModuleCompiler::FailName
                        (m,pPVar4,L"Function table [%s] size must be a power of 2",pIVar7);
      return bVar2;
    }
    pIVar7 = ParseNode::name(pPVar4);
    bVar2 = AsmJsModuleCompiler::AddFunctionTable(m,pIVar7,val);
    if (!bVar2) break;
    pIVar7 = ParseNode::name(pPVar4);
    pAVar8 = AsmJsModuleCompiler::LookupIdentifier(m,pIVar7,(AsmJsFunc *)0x0,(Source *)0x0);
    if (pAVar8 == (AsmJsSymbol *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJs.cpp"
                                  ,0x2f8,"(ftable)","ftable");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pPVar5 = ParseNode::AsParseNodeVar(pPVar4);
    pPVar6 = ParseNode::AsParseNodeArrLit(pPVar5->pnodeInit);
    local_48 = (pPVar6->super_ParseNodeUni).pnode1;
    if (local_48->nop == knopList) {
      local_48 = ParserWrapper::GetBinaryLeft(local_48);
    }
    bVar2 = ParserWrapper::IsNameDeclaration(local_48);
    if (!bVar2) {
      pIVar7 = ParseNode::name(pPVar4);
      bVar2 = AsmJsModuleCompiler::FailName
                        (m,local_48,L"Invalid element in function table %s",pIVar7);
      return bVar2;
    }
    varStmt._4_4_ = varStmt._4_4_ + 1;
    pPVar4 = ParserWrapper::GetBinaryRight(*val_00);
    *val_00 = pPVar4;
  }
  pIVar7 = ParseNode::name(pPVar4);
  bVar2 = AsmJsModuleCompiler::FailName(m,pPVar4,L"Unable to create new function table %s",pIVar7);
  return bVar2;
}

Assistant:

bool AsmJSCompiler::CheckFunctionTables(AsmJsModuleCompiler &m)
    {
        AsmJSParser& list = m.GetCurrentParserNode();
        Assert(list->nop == knopList);

        int32 funcPtrTableCount = 0;
        while (list->nop != knopEndCode)
        {
            ParseNode * varStmt = ParserWrapper::GetBinaryLeft(list);
            if (varStmt->nop != knopConstDecl && varStmt->nop != knopVarDecl)
            {
                break;
            }
            if (!varStmt->AsParseNodeVar()->pnodeInit || varStmt->AsParseNodeVar()->pnodeInit->nop != knopArray)
            {
                break;
            }
            const uint tableSize = varStmt->AsParseNodeVar()->pnodeInit->AsParseNodeArrLit()->count;
            if (!::Math::IsPow2(tableSize))
            {
                return m.FailName(varStmt, _u("Function table [%s] size must be a power of 2"), varStmt->name());
            }
            if (!m.AddFunctionTable(varStmt->name(), tableSize))
            {
                return m.FailName(varStmt, _u("Unable to create new function table %s"), varStmt->name());
            }

            AsmJsFunctionTable* ftable = (AsmJsFunctionTable*)m.LookupIdentifier(varStmt->name());
            Assert(ftable);
            ParseNode* pnode = varStmt->AsParseNodeVar()->pnodeInit->AsParseNodeArrLit()->pnode1;
            if (pnode->nop == knopList)
            {
                pnode = ParserWrapper::GetBinaryLeft(pnode);
            }
            if (!ParserWrapper::IsNameDeclaration(pnode))
            {
                return m.FailName(pnode, _u("Invalid element in function table %s"), varStmt->name());
            }
            ++funcPtrTableCount;
            list = ParserWrapper::GetBinaryRight(list);
        }

        m.SetFuncPtrTableCount(funcPtrTableCount);

        m.SetCurrentParseNode(list);
        return true;
    }